

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::ipv4_peer_with_ipv6_addrMe_test::test_method(ipv4_peer_with_ipv6_addrMe_test *this)

{
  mapped_type mVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  GlobalMutex *pszName;
  long in_FS_OFFSET;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode;
  in_addr ipv4AddrPeer;
  LocalServiceInfo lsi;
  in_addr raw_addr;
  UniqueLock<GlobalMutex> criticalblock31;
  UniqueLock<GlobalMutex> criticalblock30;
  CAddress addrLocal;
  in6_addr ipv6AddrLocal;
  CAddress addr;
  CNetAddr mapLocalHost_entry;
  CService *in_stack_fffffffffffffd18;
  CAddress *this_00;
  in_addr *in_stack_fffffffffffffd20;
  key_type *__x;
  CService *in_stack_fffffffffffffd28;
  CService *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  atomic<bool> *this_02;
  undefined4 in_stack_fffffffffffffd38;
  undefined1 fTry;
  int in_stack_fffffffffffffd3c;
  CService *in_stack_fffffffffffffd40;
  CAddress *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  CService *in_stack_fffffffffffffd58;
  CNode *in_stack_fffffffffffffd60;
  CNode *in_stack_fffffffffffffd88;
  const_string local_260;
  int *in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdb8;
  CAddress *in_stack_fffffffffffffdc0;
  void **in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffdd0;
  assertion_result local_218 [2];
  atomic<bool> local_1dd;
  undefined4 local_1dc;
  CAddress *in_stack_fffffffffffffe40;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined2 in_stack_fffffffffffffe52;
  bool *in_stack_fffffffffffffe58;
  key_type local_e0;
  CAddress local_c0 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = htonl(0x7f000001);
  CNetAddr::CNetAddr(&in_stack_fffffffffffffd40->super_CNetAddr,
                     (in_addr *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_fffffffffffffd18);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)in_stack_fffffffffffffd58,
             (GlobalMutex *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             (char *)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd3c,SUB41((uint)in_stack_fffffffffffffd38 >> 0x18,0));
  uVar5 = 0x17;
  uVar6 = 0x2a;
  pmVar3 = std::
           map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
           ::operator[]((map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
                         *)in_stack_fffffffffffffd40,
                        (key_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  mVar1.nPort = uVar6;
  mVar1.nScore = uVar5;
  mVar1._6_2_ = in_stack_fffffffffffffe52;
  *pmVar3 = mVar1;
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_fffffffffffffd18);
  uVar4 = 0xa0b0c001;
  CService::CService(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                     (uint16_t)((ulong)in_stack_fffffffffffffd18 >> 0x30));
  CAddress::CAddress(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  CService::~CService(in_stack_fffffffffffffd18);
  CAddress::CAddress((CAddress *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  __x = &local_e0;
  std::__cxx11::string::string(in_stack_fffffffffffffd30);
  local_1dc = 1;
  local_1dd._M_base._M_i = (__atomic_base<bool>)false;
  this_02 = &local_1dd;
  this_01 = (CService *)&local_1dc;
  this_00 = local_c0;
  std::
  make_unique<CNode,int,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string,ConnectionType,bool>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffe40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar5,uVar4),
             (ConnectionType *)CONCAT44(uVar2,CONCAT22(in_stack_fffffffffffffe52,uVar6)),
             in_stack_fffffffffffffe58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  CAddress::~CAddress(this_00);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::operator->
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)this_00);
  std::atomic<bool>::store(this_02,SUB81((ulong)this_01 >> 0x38,0),(memory_order)this_01);
  CService::CService(this_01,(in6_addr *)__x,(uint16_t)((ulong)this_00 >> 0x30));
  CAddress::CAddress(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  CService::~CService(&this_00->super_CService);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::operator->
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)this_00);
  CNode::SetAddrLocal(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::operator*
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)this_01);
  GetLocalAddrForPeer(in_stack_fffffffffffffd88);
  std::optional<CService>::~optional((optional<CService> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)__x,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd58,
               (const_string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (size_t)in_stack_fffffffffffffd48,(const_string *)in_stack_fffffffffffffd40);
    boost::test_tools::assertion_result::assertion_result<int>
              ((assertion_result *)this_01,(int *)__x);
    in_stack_fffffffffffffd58 = (CService *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)__x,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)__x,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)__x,(unsigned_long)this_00);
    this_00 = (CAddress *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_218,(lazy_ostream *)&stack0xfffffffffffffdc0,&local_260,0x27d,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_fffffffffffffd57 = boost::test_tools::tt_detail::dummy_cond();
    fTry = (undefined1)((uint)in_stack_fffffffffffffd38 >> 0x18);
  } while ((bool)in_stack_fffffffffffffd57);
  pszName = MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)this_00);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)in_stack_fffffffffffffd58,
             (GlobalMutex *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             (char *)pszName,(char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,(bool)fTry)
  ;
  std::
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::erase((map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
           *)this_01,__x);
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)this_00);
  CAddress::~CAddress(this_00);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)this_01);
  CAddress::~CAddress(this_00);
  CNetAddr::~CNetAddr((CNetAddr *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ipv4_peer_with_ipv6_addrMe_test)
{
    // set up local addresses; all that's necessary to reproduce the bug is
    // that a normal IPv4 address is among the entries, but if this address is
    // !IsRoutable the undefined behavior is easier to trigger deterministically
    in_addr raw_addr;
    raw_addr.s_addr = htonl(0x7f000001);
    const CNetAddr mapLocalHost_entry = CNetAddr(raw_addr);
    {
        LOCK(g_maplocalhost_mutex);
        LocalServiceInfo lsi;
        lsi.nScore = 23;
        lsi.nPort = 42;
        mapLocalHost[mapLocalHost_entry] = lsi;
    }

    // create a peer with an IPv4 address
    in_addr ipv4AddrPeer;
    ipv4AddrPeer.s_addr = 0xa0b0c001;
    CAddress addr = CAddress(CService(ipv4AddrPeer, 7777), NODE_NETWORK);
    std::unique_ptr<CNode> pnode = std::make_unique<CNode>(/*id=*/0,
                                                           /*sock=*/nullptr,
                                                           addr,
                                                           /*nKeyedNetGroupIn=*/0,
                                                           /*nLocalHostNonceIn=*/0,
                                                           CAddress{},
                                                           /*pszDest=*/std::string{},
                                                           ConnectionType::OUTBOUND_FULL_RELAY,
                                                           /*inbound_onion=*/false);
    pnode->fSuccessfullyConnected.store(true);

    // the peer claims to be reaching us via IPv6
    in6_addr ipv6AddrLocal;
    memset(ipv6AddrLocal.s6_addr, 0, 16);
    ipv6AddrLocal.s6_addr[0] = 0xcc;
    CAddress addrLocal = CAddress(CService(ipv6AddrLocal, 7777), NODE_NETWORK);
    pnode->SetAddrLocal(addrLocal);

    // before patch, this causes undefined behavior detectable with clang's -fsanitize=memory
    GetLocalAddrForPeer(*pnode);

    // suppress no-checks-run warning; if this test fails, it's by triggering a sanitizer
    BOOST_CHECK(1);

    // Cleanup, so that we don't confuse other tests.
    {
        LOCK(g_maplocalhost_mutex);
        mapLocalHost.erase(mapLocalHost_entry);
    }
}